

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O3

void __thiscall
pbrt::RGBFilm::AddSample
          (RGBFilm *this,Point2i *pFilm,SampledSpectrum L,SampledWavelengths *lambda,
          VisibleSurface *param_4,Float weight)

{
  Pixel *pPVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  long lVar5;
  int iVar6;
  undefined1 auVar7 [64];
  undefined1 auVar9 [56];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  float fVar12;
  float fVar13;
  RGB RVar14;
  SampledSpectrum local_20;
  
  auVar10._8_56_ = L._16_56_;
  auVar10._0_8_ = L.values.values._8_8_;
  auVar7._8_56_ = L._8_56_;
  auVar7._0_8_ = L.values.values._0_8_;
  local_20.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar10._0_16_);
  auVar9 = ZEXT856(local_20.values.values._8_8_);
  RVar14 = PixelSensor::ToSensorRGB((this->super_FilmBase).sensor,&local_20,lambda);
  auVar11._4_60_ = auVar10._4_60_;
  auVar11._0_4_ = RVar14.b;
  auVar8._0_8_ = RVar14._0_8_;
  auVar8._8_56_ = auVar9;
  auVar3 = vmovshdup_avx(auVar8._0_16_);
  iVar6 = (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  auVar2 = vmaxss_avx(auVar3,auVar8._0_16_);
  auVar2 = vmaxss_avx(auVar11._0_16_,auVar2);
  fVar12 = this->maxComponentValue / auVar2._0_4_;
  bVar4 = this->maxComponentValue < auVar2._0_4_;
  lVar5 = 0;
  iVar6 = ((this->pixels).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar6) *
          ((pFilm->super_Tuple2<pbrt::Point2,_int>).y -
          (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) +
          ((pFilm->super_Tuple2<pbrt::Point2,_int>).x - iVar6);
  pPVar1 = (this->pixels).values;
  do {
    fVar13 = (float)((uint)bVar4 * (int)(RVar14.r * fVar12) + (uint)!bVar4 * (int)RVar14.r);
    if (((int)lVar5 != 0) &&
       (fVar13 = (float)((uint)bVar4 * (int)(auVar3._0_4_ * fVar12) +
                        (uint)!bVar4 * (int)auVar3._0_4_), (int)lVar5 != 1)) {
      fVar13 = (float)((uint)bVar4 * (int)(auVar11._0_4_ * fVar12) +
                      (uint)!bVar4 * (int)auVar11._0_4_);
    }
    pPVar1[iVar6].rgbSum[lVar5] = (double)(fVar13 * weight) + pPVar1[iVar6].rgbSum[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  pPVar1[iVar6].weightSum = (double)weight + pPVar1[iVar6].weightSum;
  return;
}

Assistant:

PBRT_CPU_GPU
    void AddSample(const Point2i &pFilm, SampledSpectrum L,
                   const SampledWavelengths &lambda, const VisibleSurface *,
                   Float weight) {
        // Convert sample radiance to _PixelSensor_ RGB
        RGB rgb = sensor->ToSensorRGB(L, lambda);

        // Optionally clamp sensor RGB value
        Float m = std::max({rgb.r, rgb.g, rgb.b});
        if (m > maxComponentValue) {
            rgb *= maxComponentValue / m;
        }

        DCHECK(InsideExclusive(pFilm, pixelBounds));
        // Update pixel values with filtered sample contribution
        Pixel &pixel = pixels[pFilm];
        for (int c = 0; c < 3; ++c)
            pixel.rgbSum[c] += weight * rgb[c];
        pixel.weightSum += weight;
    }